

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_base.h
# Opt level: O3

void __thiscall
agg::
renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
::blend_hline(renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
              *this,int x1,int y,int x2,color_type *c,cover_type cover)

{
  int iVar1;
  int x;
  int iVar2;
  
  iVar2 = x2;
  if (x2 < x1) {
    iVar2 = x1;
  }
  if (x1 < x2) {
    x2 = x1;
  }
  if ((((y <= (this->m_clip_box).y2) && ((this->m_clip_box).y1 <= y)) &&
      (iVar1 = (this->m_clip_box).x2, x2 <= iVar1)) && (x = (this->m_clip_box).x1, x <= iVar2)) {
    if (x < x2) {
      x = x2;
    }
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>
    ::blend_hline(this->m_ren,x,y,(iVar1 - x) + 1,c,cover);
    return;
  }
  return;
}

Assistant:

void blend_hline(int x1, int y, int x2, 
                         const color_type& c, cover_type cover)
        {
            if(x1 > x2) { int t = x2; x2 = x1; x1 = t; }
            if(y  > ymax()) return;
            if(y  < ymin()) return;
            if(x1 > xmax()) return;
            if(x2 < xmin()) return;

            if(x1 < xmin()) x1 = xmin();
            if(x2 > xmax()) x2 = xmax();

            m_ren->blend_hline(x1, y, x2 - x1 + 1, c, cover);
        }